

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roialign_x86_avx512.cpp
# Opt level: O1

int __thiscall
ncnn::ROIAlign_x86_avx512::forward
          (ROIAlign_x86_avx512 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  undefined8 uVar1;
  undefined8 uVar2;
  uint uVar3;
  pointer pMVar4;
  Mat *this_00;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  int pw;
  int iVar16;
  ulong uVar17;
  ulong uVar18;
  uint7 uVar20;
  _func_int ***ppp_Var19;
  int iVar21;
  uint uVar22;
  int iVar23;
  uint uVar24;
  long lVar25;
  ulong uVar26;
  void *pvVar27;
  bool bVar28;
  ushort uVar29;
  byte bVar30;
  byte bVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar52 [32];
  undefined1 auVar54 [32];
  undefined1 auVar41 [16];
  undefined1 auVar55 [32];
  undefined1 auVar42 [16];
  undefined1 auVar66 [32];
  undefined1 auVar50 [16];
  undefined1 auVar67 [32];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar56 [32];
  undefined1 auVar43 [16];
  undefined1 auVar57 [32];
  undefined1 auVar44 [16];
  undefined1 auVar58 [32];
  undefined1 auVar45 [16];
  undefined1 auVar59 [32];
  undefined1 auVar46 [16];
  undefined1 auVar78 [64];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar47 [16];
  undefined1 auVar64 [32];
  undefined1 auVar48 [16];
  undefined1 auVar65 [32];
  undefined1 auVar49 [16];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  float fVar81;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [64];
  float fVar86;
  uint uVar87;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [12];
  undefined1 in_ZMM6 [64];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  float fVar94;
  undefined1 in_ZMM16 [64];
  undefined1 in_ZMM17 [64];
  undefined1 in_ZMM18 [64];
  undefined1 in_ZMM19 [64];
  undefined1 in_ZMM22 [64];
  undefined1 in_ZMM23 [64];
  undefined1 in_ZMM24 [64];
  undefined1 in_ZMM25 [64];
  undefined1 in_ZMM26 [64];
  undefined1 in_XMM29 [16];
  vector<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_> pre_calc;
  allocator_type local_f9;
  ulong local_f8;
  ROIAlign_x86_avx512 *local_f0;
  ulong local_e8;
  void *local_e0;
  undefined1 local_d8 [16];
  ulong local_c0;
  undefined1 local_b8 [16];
  uint local_a8;
  uint uStack_a4;
  int iStack_a0;
  int iStack_9c;
  void *local_90;
  vector<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_> local_88;
  long local_70;
  void *local_68;
  long local_60;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  ulong uVar15;
  undefined1 auVar53 [32];
  undefined1 auVar51 [32];
  
  auVar91 = in_ZMM6._4_12_;
  pMVar4 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar13 = pMVar4->w;
  uVar18 = (ulong)uVar13;
  iVar11 = pMVar4->h;
  local_c0 = (ulong)(uint)pMVar4->c;
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  Mat::create(this_00,(this->super_ROIAlign).pooled_width,(this->super_ROIAlign).pooled_height,
              pMVar4->c,pMVar4->elemsize,opt->blob_allocator);
  iVar10 = -100;
  if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
    fVar86 = (this->super_ROIAlign).spatial_scale;
    uVar1 = *pMVar4[1].data;
    uVar2 = *(undefined8 *)((long)pMVar4[1].data + 8);
    local_b8._0_4_ = (float)uVar1 * fVar86;
    local_b8._4_4_ = (float)((ulong)uVar1 >> 0x20) * fVar86;
    local_b8._8_4_ = fVar86 * 0.0;
    local_b8._12_4_ = fVar86 * 0.0;
    auVar34._0_4_ = (float)uVar2 * fVar86;
    auVar34._4_4_ = (float)((ulong)uVar2 >> 0x20) * fVar86;
    auVar34._8_4_ = fVar86 * 0.0;
    auVar34._12_4_ = fVar86 * 0.0;
    bVar28 = (this->super_ROIAlign).aligned != false;
    if (bVar28) {
      local_b8._0_4_ = (float)local_b8._0_4_ + -0.5;
      local_b8._4_4_ = local_b8._4_4_ + -0.5;
      local_b8._8_4_ = local_b8._8_4_ + -0.5;
      local_b8._12_4_ = local_b8._12_4_ + -0.5;
      auVar34._0_4_ = auVar34._0_4_ + -0.5;
      auVar34._4_4_ = auVar34._4_4_ + -0.5;
      auVar34._8_4_ = auVar34._8_4_ + -0.5;
      auVar34._12_4_ = auVar34._12_4_ + -0.5;
    }
    auVar34 = vsubps_avx(auVar34,local_b8);
    auVar32._8_4_ = 0x3f800000;
    auVar32._0_8_ = 0x3f8000003f800000;
    auVar32._12_4_ = 0x3f800000;
    auVar32 = vmaxps_avx512vl(auVar34,auVar32);
    uVar87 = 0xff;
    uVar12 = 0;
    if (bVar28) {
      uVar12 = 0xff;
    }
    bVar28 = (bool)((byte)uVar12 & 1);
    auVar33._0_4_ = (uint)bVar28 * auVar34._0_4_ | (uint)!bVar28 * auVar32._0_4_;
    bVar28 = (bool)((byte)(uVar12 >> 1) & 1);
    auVar33._4_4_ = (uint)bVar28 * auVar34._4_4_ | (uint)!bVar28 * auVar32._4_4_;
    bVar28 = (bool)((byte)(uVar12 >> 2) & 1);
    auVar33._8_4_ = (uint)bVar28 * auVar34._8_4_ | (uint)!bVar28 * auVar32._8_4_;
    bVar28 = (bool)((byte)(uVar12 >> 3) & 1);
    auVar33._12_4_ = (uint)bVar28 * auVar34._12_4_ | (uint)!bVar28 * auVar32._12_4_;
    uVar12._0_4_ = (this->super_ROIAlign).pooled_width;
    uVar12._4_4_ = (this->super_ROIAlign).pooled_height;
    auVar35._8_8_ = 0;
    auVar35._0_8_ = uVar12;
    auVar34 = vcvtdq2ps_avx(auVar35);
    local_d8 = vdivps_avx(auVar33,auVar34);
    iVar10 = (this->super_ROIAlign).version;
    if (iVar10 == 1) {
      uVar22 = (this->super_ROIAlign).sampling_ratio;
      auVar34 = vroundps_avx(local_d8,10);
      auVar32 = vcvtudq2ps_avx512vl(ZEXT416(uVar22));
      local_e8 = 0;
      if ((int)uVar22 < 1) {
        uVar87 = 0;
      }
      auVar32 = vbroadcastss_avx512vl(auVar32);
      bVar28 = (bool)((byte)uVar87 & 1);
      bVar5 = (bool)((byte)(uVar87 >> 1) & 1);
      bVar6 = (bool)((byte)(uVar87 >> 2) & 1);
      bVar7 = (bool)((byte)(uVar87 >> 3) & 1);
      uVar87 = (uint)(float)((uint)bVar28 * auVar32._0_4_ | (uint)!bVar28 * auVar34._0_4_);
      uVar22 = (uint)(float)((uint)bVar5 * auVar32._4_4_ | (uint)!bVar5 * auVar34._4_4_);
      iStack_a0 = (int)(float)((uint)bVar6 * auVar32._8_4_ | (uint)!bVar6 * auVar34._8_4_);
      iStack_9c = (int)(float)((uint)bVar7 * auVar32._12_4_ | (uint)!bVar7 * auVar34._12_4_);
      local_e0 = (void *)CONCAT44(local_e0._4_4_,iVar11);
      uVar18 = (ulong)uVar22;
      local_f0 = (ROIAlign_x86_avx512 *)(long)(int)uVar22;
      local_f8 = (ulong)(int)uVar87;
      local_a8 = uVar87;
      uStack_a4 = uVar22;
      std::vector<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_>::vector
                (&local_88,
                 (long)(int)uVar12._4_4_ * (long)(int)(undefined4)uVar12 * local_f8 * (long)local_f0
                 ,&local_f9);
      auVar34 = vmovshdup_avx(local_d8);
      auVar32 = vmovshdup_avx(local_b8);
      auVar36._4_4_ = uStack_a4;
      auVar36._0_4_ = local_a8;
      auVar36._8_4_ = iStack_a0;
      auVar36._12_4_ = iStack_9c;
      iVar11 = vextractps_avx(auVar36,1);
      detectron2_pre_calc_for_bilinear_interpolate<float>
                ((int)local_e0,uVar13,(this->super_ROIAlign).pooled_height,
                 (this->super_ROIAlign).pooled_width,(int)local_f0,(int)local_f8,auVar32._0_4_,
                 local_b8._0_4_,auVar34._0_4_,local_d8._0_4_,iVar11,local_a8,&local_88);
      if (0 < (int)local_c0) {
        iVar11 = 1;
        if (1 < (int)(uVar22 * uVar87)) {
          iVar11 = uVar22 * uVar87;
        }
        local_e0 = pMVar4->data;
        local_f8 = pMVar4->cstep * pMVar4->elemsize;
        local_f0 = (ROIAlign_x86_avx512 *)this_00->data;
        local_90 = (void *)(this_00->cstep * this_00->elemsize);
        uVar13 = (this->super_ROIAlign).pooled_width;
        uVar3 = (this->super_ROIAlign).pooled_height;
        local_d8._0_4_ = uVar3;
        auVar37._4_4_ = uStack_a4;
        auVar37._0_4_ = local_a8;
        auVar37._8_4_ = iStack_a0;
        auVar37._12_4_ = iStack_9c;
        uVar12 = vpcmpd_avx512vl(ZEXT816(0) << 0x40,auVar37,1);
        local_b8._0_8_ = (long)(int)uVar13;
        uVar24 = 0;
        if (0 < (int)uVar87) {
          uVar24 = uVar87;
        }
        uVar14 = (ulong)(uVar24 * uVar22);
        lVar25 = CONCAT44((int)((ulong)this >> 0x20),(int)(uVar12 & 0xf));
        uVar15 = (ulong)(uVar87 + 0xf & 0xfffffff0);
        auVar68 = vpbroadcastq_avx512f();
        auVar69 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
        auVar70 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        auVar71 = vpbroadcastq_avx512f(ZEXT816(0x10));
        do {
          if (0 < (int)uVar3) {
            pvVar27 = (void *)(local_f8 * local_e8 + (long)local_e0);
            ppp_Var19 = (_func_int ***)
                        ((long)&(local_f0->super_ROIAlign).super_Layer._vptr_Layer +
                        (long)local_90 * local_e8);
            uVar87 = 0;
            do {
              local_a8 = uVar87;
              if (0 < (int)uVar13) {
                uVar17 = 0;
                do {
                  auVar72 = ZEXT1664(ZEXT816(0) << 0x40);
                  fVar86 = 0.0;
                  if (((uVar12 & 0xf) >> 1 & 1) != 0) {
                    uVar87 = 0;
                    auVar85 = vpbroadcastq_avx512f();
                    do {
                      if ((uVar12 & 1) != 0) {
                        auVar73 = vpbroadcastq_avx512f();
                        auVar74 = vpaddq_avx512f(auVar73,auVar69);
                        auVar73 = vpaddq_avx512f(auVar73,auVar70);
                        uVar26 = 0;
                        auVar72 = ZEXT1664(CONCAT124(ZEXT812(0) << 0x20,auVar72._0_4_));
                        do {
                          auVar78 = auVar72;
                          auVar72 = vpbroadcastq_avx512f();
                          auVar75 = vporq_avx512f(auVar72,auVar69);
                          auVar72 = vporq_avx512f(auVar72,auVar70);
                          uVar8 = vpcmpuq_avx512f(auVar72,auVar68,2);
                          uVar9 = vpcmpuq_avx512f(auVar75,auVar68,2);
                          bVar31 = (byte)uVar9;
                          bVar30 = (byte)uVar8;
                          uVar29 = CONCAT11(bVar31,bVar30);
                          auVar72 = vpsllq_avx512f(auVar73,5);
                          vpaddq_avx512f(auVar85,auVar72);
                          auVar72 = vpsllq_avx512f(auVar74,5);
                          vpaddq_avx512f(auVar85,auVar72);
                          auVar51 = vgatherqps_avx512f(*(undefined8 *)(uVar18 + 0x10));
                          auVar60._8_8_ = (ulong)((byte)(uVar9 >> 1) & 1) * auVar51._8_8_;
                          auVar60._0_8_ = (ulong)(bVar31 & 1) * auVar51._0_8_;
                          auVar60._16_8_ = (ulong)((byte)(uVar9 >> 2) & 1) * auVar51._16_8_;
                          auVar60._24_8_ = (ulong)((byte)(uVar9 >> 3) & 1) * auVar51._24_8_;
                          auVar51 = vgatherqps_avx512f(*(undefined8 *)(uVar14 + 0x10));
                          auVar72 = vinsertf64x4_avx512f
                                              (ZEXT3264(CONCAT824((ulong)((byte)(uVar8 >> 3) & 1) *
                                                                  auVar51._24_8_,
                                                                  CONCAT816((ulong)((byte)(uVar8 >> 
                                                  2) & 1) * auVar51._16_8_,
                                                  CONCAT88((ulong)((byte)(uVar8 >> 1) & 1) *
                                                           auVar51._8_8_,
                                                           (ulong)(bVar30 & 1) * auVar51._0_8_)))),
                                               auVar60,1);
                          auVar51 = vpgatherqd_avx512f(*(undefined8 *)
                                                        ((long)&(local_88.
                                                  super__Vector_base<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->pos1 +
                                                  lVar25));
                          auVar61._4_4_ = (uint)((byte)(uVar9 >> 1) & 1) * auVar51._4_4_;
                          auVar61._0_4_ = (uint)(bVar31 & 1) * auVar51._0_4_;
                          auVar61._8_4_ = (uint)((byte)(uVar9 >> 2) & 1) * auVar51._8_4_;
                          auVar61._12_4_ = (uint)((byte)(uVar9 >> 3) & 1) * auVar51._12_4_;
                          auVar61._16_4_ = (uint)((byte)(uVar9 >> 4) & 1) * auVar51._16_4_;
                          auVar61._20_4_ = (uint)((byte)(uVar9 >> 5) & 1) * auVar51._20_4_;
                          auVar61._24_4_ = (uint)((byte)(uVar9 >> 6) & 1) * auVar51._24_4_;
                          auVar61._28_4_ = (uint)(byte)(uVar9 >> 7) * auVar51._28_4_;
                          auVar51 = vpgatherqd_avx512f(*(undefined8 *)
                                                        ((long)local_88.
                                                  super__Vector_base<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start * 2));
                          vinserti64x4_avx512f
                                    (ZEXT3264(CONCAT428((uint)(byte)(uVar8 >> 7) * auVar51._28_4_,
                                                        CONCAT424((uint)((byte)(uVar8 >> 6) & 1) *
                                                                  auVar51._24_4_,
                                                                  CONCAT420((uint)((byte)(uVar8 >> 5
                                                                                         ) & 1) *
                                                                            auVar51._20_4_,
                                                                            CONCAT416((uint)((byte)(
                                                  uVar8 >> 4) & 1) * auVar51._16_4_,
                                                  CONCAT412((uint)((byte)(uVar8 >> 3) & 1) *
                                                            auVar51._12_4_,
                                                            CONCAT48((uint)((byte)(uVar8 >> 2) & 1)
                                                                     * auVar51._8_4_,
                                                                     CONCAT44((uint)((byte)(uVar8 >>
                                                                                           1) & 1) *
                                                                              auVar51._4_4_,
                                                                              (uint)(bVar30 & 1) *
                                                                              auVar51._0_4_)))))))),
                                     auVar61,1);
                          auVar76 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar27 + lVar25 * 4));
                          auVar75._4_4_ = (uint)((byte)(uVar29 >> 1) & 1) * auVar76._4_4_;
                          auVar75._0_4_ = (uint)(bVar30 & 1) * auVar76._0_4_;
                          auVar75._8_4_ = (uint)((byte)(uVar29 >> 2) & 1) * auVar76._8_4_;
                          auVar75._12_4_ = (uint)((byte)(uVar29 >> 3) & 1) * auVar76._12_4_;
                          auVar75._16_4_ = (uint)((byte)(uVar29 >> 4) & 1) * auVar76._16_4_;
                          auVar75._20_4_ = (uint)((byte)(uVar29 >> 5) & 1) * auVar76._20_4_;
                          auVar75._24_4_ = (uint)((byte)(uVar29 >> 6) & 1) * auVar76._24_4_;
                          auVar75._28_4_ = (uint)((byte)(uVar29 >> 7) & 1) * auVar76._28_4_;
                          auVar75._32_4_ = (uint)(bVar31 & 1) * auVar76._32_4_;
                          auVar75._36_4_ = (uint)(bVar31 >> 1 & 1) * auVar76._36_4_;
                          auVar75._40_4_ = (uint)(bVar31 >> 2 & 1) * auVar76._40_4_;
                          auVar75._44_4_ = (uint)(bVar31 >> 3 & 1) * auVar76._44_4_;
                          auVar75._48_4_ = (uint)(bVar31 >> 4 & 1) * auVar76._48_4_;
                          auVar75._52_4_ = (uint)(bVar31 >> 5 & 1) * auVar76._52_4_;
                          auVar75._56_4_ = (uint)(bVar31 >> 6 & 1) * auVar76._56_4_;
                          auVar75._60_4_ = (uint)(bVar31 >> 7) * auVar76._60_4_;
                          auVar51 = vgatherqps_avx512f(*(undefined8 *)(uVar18 + 0x14));
                          auVar62._8_8_ = (ulong)((byte)(uVar9 >> 1) & 1) * auVar51._8_8_;
                          auVar62._0_8_ = (ulong)(bVar31 & 1) * auVar51._0_8_;
                          auVar62._16_8_ = (ulong)((byte)(uVar9 >> 2) & 1) * auVar51._16_8_;
                          auVar62._24_8_ = (ulong)((byte)(uVar9 >> 3) & 1) * auVar51._24_8_;
                          auVar51 = vgatherqps_avx512f(*(undefined8 *)(uVar14 + 0x14));
                          auVar76 = vinsertf64x4_avx512f
                                              (ZEXT3264(CONCAT824((ulong)((byte)(uVar8 >> 3) & 1) *
                                                                  auVar51._24_8_,
                                                                  CONCAT816((ulong)((byte)(uVar8 >> 
                                                  2) & 1) * auVar51._16_8_,
                                                  CONCAT88((ulong)((byte)(uVar8 >> 1) & 1) *
                                                           auVar51._8_8_,
                                                           (ulong)(bVar30 & 1) * auVar51._0_8_)))),
                                               auVar62,1);
                          auVar51 = vpgatherqd_avx512f(*(undefined8 *)(uVar18 + 4));
                          auVar63._4_4_ = (uint)((byte)(uVar9 >> 1) & 1) * auVar51._4_4_;
                          auVar63._0_4_ = (uint)(bVar31 & 1) * auVar51._0_4_;
                          auVar63._8_4_ = (uint)((byte)(uVar9 >> 2) & 1) * auVar51._8_4_;
                          auVar63._12_4_ = (uint)((byte)(uVar9 >> 3) & 1) * auVar51._12_4_;
                          auVar63._16_4_ = (uint)((byte)(uVar9 >> 4) & 1) * auVar51._16_4_;
                          auVar63._20_4_ = (uint)((byte)(uVar9 >> 5) & 1) * auVar51._20_4_;
                          auVar63._24_4_ = (uint)((byte)(uVar9 >> 6) & 1) * auVar51._24_4_;
                          auVar63._28_4_ = (uint)(byte)(uVar9 >> 7) * auVar51._28_4_;
                          auVar34 = vpxord_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
                          auVar51 = vpgatherqd_avx512f(*(undefined8 *)(uVar14 + 4));
                          auVar47._0_4_ =
                               (uint)(bVar30 & 1) * auVar51._0_4_ |
                               (uint)!(bool)(bVar30 & 1) * auVar34._0_4_;
                          bVar28 = (bool)((byte)(uVar8 >> 1) & 1);
                          auVar47._4_4_ =
                               (uint)bVar28 * auVar51._4_4_ | (uint)!bVar28 * auVar34._4_4_;
                          bVar28 = (bool)((byte)(uVar8 >> 2) & 1);
                          auVar47._8_4_ =
                               (uint)bVar28 * auVar51._8_4_ | (uint)!bVar28 * auVar34._8_4_;
                          bVar28 = (bool)((byte)(uVar8 >> 3) & 1);
                          auVar47._12_4_ =
                               (uint)bVar28 * auVar51._12_4_ | (uint)!bVar28 * auVar34._12_4_;
                          vinserti64x4_avx512f
                                    (ZEXT3264(CONCAT428((uint)(byte)(uVar8 >> 7) * auVar51._28_4_,
                                                        CONCAT424((uint)((byte)(uVar8 >> 6) & 1) *
                                                                  auVar51._24_4_,
                                                                  CONCAT420((uint)((byte)(uVar8 >> 5
                                                                                         ) & 1) *
                                                                            auVar51._20_4_,
                                                                            CONCAT416((uint)((byte)(
                                                  uVar8 >> 4) & 1) * auVar51._16_4_,auVar47))))),
                                     auVar63,1);
                          auVar34 = vpxord_avx512vl(auVar47,auVar47);
                          auVar77 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar27 + uVar15 * 4));
                          in_ZMM16._0_4_ =
                               (uint)(bVar30 & 1) * auVar77._0_4_ |
                               (uint)!(bool)(bVar30 & 1) * auVar34._0_4_;
                          bVar28 = (bool)((byte)(uVar29 >> 1) & 1);
                          in_ZMM16._4_4_ =
                               (uint)bVar28 * auVar77._4_4_ | (uint)!bVar28 * auVar34._4_4_;
                          bVar28 = (bool)((byte)(uVar29 >> 2) & 1);
                          in_ZMM16._8_4_ =
                               (uint)bVar28 * auVar77._8_4_ | (uint)!bVar28 * auVar34._8_4_;
                          bVar28 = (bool)((byte)(uVar29 >> 3) & 1);
                          in_ZMM16._12_4_ =
                               (uint)bVar28 * auVar77._12_4_ | (uint)!bVar28 * auVar34._12_4_;
                          in_ZMM16._16_4_ = (uint)((byte)(uVar29 >> 4) & 1) * auVar77._16_4_;
                          in_ZMM16._20_4_ = (uint)((byte)(uVar29 >> 5) & 1) * auVar77._20_4_;
                          in_ZMM16._24_4_ = (uint)((byte)(uVar29 >> 6) & 1) * auVar77._24_4_;
                          in_ZMM16._28_4_ = (uint)((byte)(uVar29 >> 7) & 1) * auVar77._28_4_;
                          in_ZMM16._32_4_ = (uint)(bVar31 & 1) * auVar77._32_4_;
                          in_ZMM16._36_4_ = (uint)(bVar31 >> 1 & 1) * auVar77._36_4_;
                          in_ZMM16._40_4_ = (uint)(bVar31 >> 2 & 1) * auVar77._40_4_;
                          in_ZMM16._44_4_ = (uint)(bVar31 >> 3 & 1) * auVar77._44_4_;
                          in_ZMM16._48_4_ = (uint)(bVar31 >> 4 & 1) * auVar77._48_4_;
                          in_ZMM16._52_4_ = (uint)(bVar31 >> 5 & 1) * auVar77._52_4_;
                          in_ZMM16._56_4_ = (uint)(bVar31 >> 6 & 1) * auVar77._56_4_;
                          in_ZMM16._60_4_ = (uint)(bVar31 >> 7) * auVar77._60_4_;
                          auVar51 = vgatherqps_avx512f(*(undefined8 *)(uVar18 + 0x18));
                          auVar64._8_8_ = (ulong)((byte)(uVar9 >> 1) & 1) * auVar51._8_8_;
                          auVar64._0_8_ = (ulong)(bVar31 & 1) * auVar51._0_8_;
                          auVar64._16_8_ = (ulong)((byte)(uVar9 >> 2) & 1) * auVar51._16_8_;
                          auVar64._24_8_ = (ulong)((byte)(uVar9 >> 3) & 1) * auVar51._24_8_;
                          auVar34 = vxorps_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
                          auVar51 = vgatherqps_avx512f(*(undefined8 *)(uVar14 + 0x18));
                          auVar48._0_8_ =
                               (ulong)(bVar30 & 1) * auVar51._0_8_ |
                               (ulong)!(bool)(bVar30 & 1) * auVar34._0_8_;
                          bVar28 = (bool)((byte)(uVar8 >> 1) & 1);
                          auVar48._8_8_ =
                               (ulong)bVar28 * auVar51._8_8_ | (ulong)!bVar28 * auVar34._8_8_;
                          auVar77 = vinsertf64x4_avx512f
                                              (ZEXT3264(CONCAT824((ulong)((byte)(uVar8 >> 3) & 1) *
                                                                  auVar51._24_8_,
                                                                  CONCAT816((ulong)((byte)(uVar8 >> 
                                                  2) & 1) * auVar51._16_8_,auVar48))),auVar64,1);
                          auVar34 = vxorps_avx512vl(auVar48,auVar48);
                          auVar51 = vpgatherqd_avx512f(*(undefined8 *)(uVar18 + 8));
                          auVar65._0_4_ =
                               (uint)(bVar31 & 1) * auVar51._0_4_ |
                               (uint)!(bool)(bVar31 & 1) * auVar34._0_4_;
                          bVar28 = (bool)((byte)(uVar9 >> 1) & 1);
                          auVar65._4_4_ =
                               (uint)bVar28 * auVar51._4_4_ | (uint)!bVar28 * auVar34._4_4_;
                          bVar28 = (bool)((byte)(uVar9 >> 2) & 1);
                          auVar65._8_4_ =
                               (uint)bVar28 * auVar51._8_4_ | (uint)!bVar28 * auVar34._8_4_;
                          bVar28 = (bool)((byte)(uVar9 >> 3) & 1);
                          auVar65._12_4_ =
                               (uint)bVar28 * auVar51._12_4_ | (uint)!bVar28 * auVar34._12_4_;
                          auVar65._16_4_ = (uint)((byte)(uVar9 >> 4) & 1) * auVar51._16_4_;
                          auVar65._20_4_ = (uint)((byte)(uVar9 >> 5) & 1) * auVar51._20_4_;
                          auVar65._24_4_ = (uint)((byte)(uVar9 >> 6) & 1) * auVar51._24_4_;
                          auVar65._28_4_ = (uint)(byte)(uVar9 >> 7) * auVar51._28_4_;
                          auVar34 = vpxord_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
                          auVar51 = vpgatherqd_avx512f(*(undefined8 *)(uVar14 + 8));
                          auVar49._0_4_ =
                               (uint)(bVar30 & 1) * auVar51._0_4_ |
                               (uint)!(bool)(bVar30 & 1) * auVar34._0_4_;
                          bVar28 = (bool)((byte)(uVar8 >> 1) & 1);
                          auVar49._4_4_ =
                               (uint)bVar28 * auVar51._4_4_ | (uint)!bVar28 * auVar34._4_4_;
                          bVar28 = (bool)((byte)(uVar8 >> 2) & 1);
                          auVar49._8_4_ =
                               (uint)bVar28 * auVar51._8_4_ | (uint)!bVar28 * auVar34._8_4_;
                          bVar28 = (bool)((byte)(uVar8 >> 3) & 1);
                          auVar49._12_4_ =
                               (uint)bVar28 * auVar51._12_4_ | (uint)!bVar28 * auVar34._12_4_;
                          auVar79 = vinserti64x4_avx512f
                                              (ZEXT3264(CONCAT428((uint)(byte)(uVar8 >> 7) *
                                                                  auVar51._28_4_,
                                                                  CONCAT424((uint)((byte)(uVar8 >> 6
                                                                                         ) & 1) *
                                                                            auVar51._24_4_,
                                                                            CONCAT420((uint)((byte)(
                                                  uVar8 >> 5) & 1) * auVar51._20_4_,
                                                  CONCAT416((uint)((byte)(uVar8 >> 4) & 1) *
                                                            auVar51._16_4_,auVar49))))),auVar65,1);
                          auVar34 = vpxord_avx512vl(auVar49,auVar49);
                          auVar80 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar27 * 5));
                          in_ZMM18._0_4_ =
                               (uint)(bVar30 & 1) * auVar80._0_4_ |
                               (uint)!(bool)(bVar30 & 1) * auVar34._0_4_;
                          bVar28 = (bool)((byte)(uVar29 >> 1) & 1);
                          in_ZMM18._4_4_ =
                               (uint)bVar28 * auVar80._4_4_ | (uint)!bVar28 * auVar34._4_4_;
                          bVar28 = (bool)((byte)(uVar29 >> 2) & 1);
                          in_ZMM18._8_4_ =
                               (uint)bVar28 * auVar80._8_4_ | (uint)!bVar28 * auVar34._8_4_;
                          bVar28 = (bool)((byte)(uVar29 >> 3) & 1);
                          in_ZMM18._12_4_ =
                               (uint)bVar28 * auVar80._12_4_ | (uint)!bVar28 * auVar34._12_4_;
                          in_ZMM18._16_4_ = (uint)((byte)(uVar29 >> 4) & 1) * auVar80._16_4_;
                          in_ZMM18._20_4_ = (uint)((byte)(uVar29 >> 5) & 1) * auVar80._20_4_;
                          in_ZMM18._24_4_ = (uint)((byte)(uVar29 >> 6) & 1) * auVar80._24_4_;
                          in_ZMM18._28_4_ = (uint)((byte)(uVar29 >> 7) & 1) * auVar80._28_4_;
                          in_ZMM18._32_4_ = (uint)(bVar31 & 1) * auVar80._32_4_;
                          in_ZMM18._36_4_ = (uint)(bVar31 >> 1 & 1) * auVar80._36_4_;
                          in_ZMM18._40_4_ = (uint)(bVar31 >> 2 & 1) * auVar80._40_4_;
                          in_ZMM18._44_4_ = (uint)(bVar31 >> 3 & 1) * auVar80._44_4_;
                          in_ZMM18._48_4_ = (uint)(bVar31 >> 4 & 1) * auVar80._48_4_;
                          in_ZMM18._52_4_ = (uint)(bVar31 >> 5 & 1) * auVar80._52_4_;
                          in_ZMM18._56_4_ = (uint)(bVar31 >> 6 & 1) * auVar80._56_4_;
                          in_ZMM18._60_4_ = (uint)(bVar31 >> 7) * auVar80._60_4_;
                          auVar34 = vxorps_avx512vl(auVar79._0_16_,auVar79._0_16_);
                          auVar51 = vgatherqps_avx512f(*(undefined8 *)(uVar18 + 0x1c));
                          auVar66._0_8_ =
                               (ulong)(bVar31 & 1) * auVar51._0_8_ |
                               (ulong)!(bool)(bVar31 & 1) * auVar34._0_8_;
                          bVar28 = (bool)((byte)(uVar9 >> 1) & 1);
                          auVar66._8_8_ =
                               (ulong)bVar28 * auVar51._8_8_ | (ulong)!bVar28 * auVar34._8_8_;
                          auVar66._16_8_ = (ulong)((byte)(uVar9 >> 2) & 1) * auVar51._16_8_;
                          auVar66._24_8_ = (ulong)((byte)(uVar9 >> 3) & 1) * auVar51._24_8_;
                          auVar34 = vxorps_avx512vl(in_ZMM19._0_16_,in_ZMM19._0_16_);
                          auVar51 = vgatherqps_avx512f(*(undefined8 *)(uVar14 + 0x1c));
                          auVar50._0_8_ =
                               (ulong)(bVar30 & 1) * auVar51._0_8_ |
                               (ulong)!(bool)(bVar30 & 1) * auVar34._0_8_;
                          bVar28 = (bool)((byte)(uVar8 >> 1) & 1);
                          auVar50._8_8_ =
                               (ulong)bVar28 * auVar51._8_8_ | (ulong)!bVar28 * auVar34._8_8_;
                          in_ZMM17 = vinsertf64x4_avx512f
                                               (ZEXT3264(CONCAT824((ulong)((byte)(uVar8 >> 3) & 1) *
                                                                   auVar51._24_8_,
                                                                   CONCAT816((ulong)((byte)(uVar8 >>
                                                                                           2) & 1) *
                                                                             auVar51._16_8_,auVar50)
                                                                  )),auVar66,1);
                          auVar34 = vxorps_avx512vl(auVar50,auVar50);
                          auVar51 = vpgatherqd_avx512f(*(undefined8 *)(uVar18 + 0xc));
                          auVar67._0_4_ =
                               (uint)(bVar31 & 1) * auVar51._0_4_ |
                               (uint)!(bool)(bVar31 & 1) * auVar34._0_4_;
                          bVar28 = (bool)((byte)(uVar9 >> 1) & 1);
                          auVar67._4_4_ =
                               (uint)bVar28 * auVar51._4_4_ | (uint)!bVar28 * auVar34._4_4_;
                          bVar28 = (bool)((byte)(uVar9 >> 2) & 1);
                          auVar67._8_4_ =
                               (uint)bVar28 * auVar51._8_4_ | (uint)!bVar28 * auVar34._8_4_;
                          bVar28 = (bool)((byte)(uVar9 >> 3) & 1);
                          auVar67._12_4_ =
                               (uint)bVar28 * auVar51._12_4_ | (uint)!bVar28 * auVar34._12_4_;
                          auVar67._16_4_ = (uint)((byte)(uVar9 >> 4) & 1) * auVar51._16_4_;
                          auVar67._20_4_ = (uint)((byte)(uVar9 >> 5) & 1) * auVar51._20_4_;
                          auVar67._24_4_ = (uint)((byte)(uVar9 >> 6) & 1) * auVar51._24_4_;
                          auVar67._28_4_ = (uint)(byte)(uVar9 >> 7) * auVar51._28_4_;
                          in_ZMM19 = ZEXT3264(auVar67);
                          auVar51 = vpgatherqd_avx512f(*(undefined8 *)(uVar14 + 0xc));
                          vinserti64x4_avx512f
                                    (ZEXT3264(CONCAT428((uint)(byte)(uVar8 >> 7) * auVar51._28_4_,
                                                        CONCAT424((uint)((byte)(uVar8 >> 6) & 1) *
                                                                  auVar51._24_4_,
                                                                  CONCAT420((uint)((byte)(uVar8 >> 5
                                                                                         ) & 1) *
                                                                            auVar51._20_4_,
                                                                            CONCAT416((uint)((byte)(
                                                  uVar8 >> 4) & 1) * auVar51._16_4_,
                                                  CONCAT412((uint)((byte)(uVar8 >> 3) & 1) *
                                                            auVar51._12_4_,
                                                            CONCAT48((uint)((byte)(uVar8 >> 2) & 1)
                                                                     * auVar51._8_4_,
                                                                     CONCAT44((uint)((byte)(uVar8 >>
                                                                                           1) & 1) *
                                                                              auVar51._4_4_,
                                                                              (uint)(bVar30 & 1) *
                                                                              auVar51._0_4_)))))))),
                                     auVar67,1);
                          auVar79 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar27 + uVar14 * 4));
                          auVar80._4_4_ = (uint)((byte)(uVar29 >> 1) & 1) * auVar79._4_4_;
                          auVar80._0_4_ = (uint)(bVar30 & 1) * auVar79._0_4_;
                          auVar80._8_4_ = (uint)((byte)(uVar29 >> 2) & 1) * auVar79._8_4_;
                          auVar80._12_4_ = (uint)((byte)(uVar29 >> 3) & 1) * auVar79._12_4_;
                          auVar80._16_4_ = (uint)((byte)(uVar29 >> 4) & 1) * auVar79._16_4_;
                          auVar80._20_4_ = (uint)((byte)(uVar29 >> 5) & 1) * auVar79._20_4_;
                          auVar80._24_4_ = (uint)((byte)(uVar29 >> 6) & 1) * auVar79._24_4_;
                          auVar80._28_4_ = (uint)((byte)(uVar29 >> 7) & 1) * auVar79._28_4_;
                          auVar80._32_4_ = (uint)(bVar31 & 1) * auVar79._32_4_;
                          auVar80._36_4_ = (uint)(bVar31 >> 1 & 1) * auVar79._36_4_;
                          auVar80._40_4_ = (uint)(bVar31 >> 2 & 1) * auVar79._40_4_;
                          auVar80._44_4_ = (uint)(bVar31 >> 3 & 1) * auVar79._44_4_;
                          auVar80._48_4_ = (uint)(bVar31 >> 4 & 1) * auVar79._48_4_;
                          auVar80._52_4_ = (uint)(bVar31 >> 5 & 1) * auVar79._52_4_;
                          auVar80._56_4_ = (uint)(bVar31 >> 6 & 1) * auVar79._56_4_;
                          auVar80._60_4_ = (uint)(bVar31 >> 7) * auVar79._60_4_;
                          auVar72 = vfmadd213ps_avx512f(auVar75,auVar72,auVar78);
                          auVar72 = vfmadd231ps_avx512f(auVar72,auVar76,in_ZMM16);
                          auVar72 = vfmadd231ps_avx512f(auVar72,auVar77,in_ZMM18);
                          auVar72 = vfmadd231ps_avx512f(auVar72,in_ZMM17,auVar80);
                          uVar26 = uVar26 + 0x10;
                          auVar73 = vpaddq_avx512f(auVar73,auVar71);
                          auVar74 = vpaddq_avx512f(auVar74,auVar71);
                        } while (uVar15 != uVar26);
                        auVar73._0_4_ =
                             (uint)(bVar30 & 1) * auVar72._0_4_ |
                             (uint)!(bool)(bVar30 & 1) * auVar78._0_4_;
                        bVar28 = (bool)((byte)(uVar29 >> 1) & 1);
                        auVar73._4_4_ = (uint)bVar28 * auVar72._4_4_ | (uint)!bVar28 * auVar78._4_4_
                        ;
                        bVar28 = (bool)((byte)(uVar29 >> 2) & 1);
                        auVar73._8_4_ = (uint)bVar28 * auVar72._8_4_ | (uint)!bVar28 * auVar78._8_4_
                        ;
                        bVar28 = (bool)((byte)(uVar29 >> 3) & 1);
                        auVar73._12_4_ =
                             (uint)bVar28 * auVar72._12_4_ | (uint)!bVar28 * auVar78._12_4_;
                        bVar28 = (bool)((byte)(uVar29 >> 4) & 1);
                        auVar73._16_4_ =
                             (uint)bVar28 * auVar72._16_4_ | (uint)!bVar28 * auVar78._16_4_;
                        bVar28 = (bool)((byte)(uVar29 >> 5) & 1);
                        auVar73._20_4_ =
                             (uint)bVar28 * auVar72._20_4_ | (uint)!bVar28 * auVar78._20_4_;
                        bVar28 = (bool)((byte)(uVar29 >> 6) & 1);
                        auVar73._24_4_ =
                             (uint)bVar28 * auVar72._24_4_ | (uint)!bVar28 * auVar78._24_4_;
                        bVar28 = (bool)((byte)(uVar29 >> 7) & 1);
                        auVar73._28_4_ =
                             (uint)bVar28 * auVar72._28_4_ | (uint)!bVar28 * auVar78._28_4_;
                        auVar73._32_4_ =
                             (uint)(bVar31 & 1) * auVar72._32_4_ |
                             (uint)!(bool)(bVar31 & 1) * auVar78._32_4_;
                        bVar28 = (bool)(bVar31 >> 1 & 1);
                        auVar73._36_4_ =
                             (uint)bVar28 * auVar72._36_4_ | (uint)!bVar28 * auVar78._36_4_;
                        bVar28 = (bool)(bVar31 >> 2 & 1);
                        auVar73._40_4_ =
                             (uint)bVar28 * auVar72._40_4_ | (uint)!bVar28 * auVar78._40_4_;
                        bVar28 = (bool)(bVar31 >> 3 & 1);
                        auVar73._44_4_ =
                             (uint)bVar28 * auVar72._44_4_ | (uint)!bVar28 * auVar78._44_4_;
                        bVar28 = (bool)(bVar31 >> 4 & 1);
                        auVar73._48_4_ =
                             (uint)bVar28 * auVar72._48_4_ | (uint)!bVar28 * auVar78._48_4_;
                        bVar28 = (bool)(bVar31 >> 5 & 1);
                        auVar73._52_4_ =
                             (uint)bVar28 * auVar72._52_4_ | (uint)!bVar28 * auVar78._52_4_;
                        bVar28 = (bool)(bVar31 >> 6 & 1);
                        auVar73._56_4_ =
                             (uint)bVar28 * auVar72._56_4_ | (uint)!bVar28 * auVar78._56_4_;
                        auVar73._60_4_ =
                             (uint)(bVar31 >> 7) * auVar72._60_4_ |
                             (uint)!(bool)(bVar31 >> 7) * auVar78._60_4_;
                        auVar51 = vextractf64x4_avx512f(auVar73,1);
                        auVar72 = vaddps_avx512f(auVar73,ZEXT3264(auVar51));
                        auVar92._0_4_ = auVar72._16_4_ + auVar72._0_4_;
                        auVar92._4_4_ = auVar72._20_4_ + auVar72._4_4_;
                        auVar92._8_4_ = auVar72._24_4_ + auVar72._8_4_;
                        auVar92._12_4_ = auVar72._28_4_ + auVar72._12_4_;
                        auVar34 = vshufpd_avx(auVar92,auVar92,1);
                        auVar93._0_4_ = auVar34._0_4_ + auVar92._0_4_;
                        auVar93._4_4_ = auVar34._4_4_ + auVar92._4_4_;
                        auVar93._8_4_ = auVar34._8_4_ + auVar92._8_4_;
                        auVar93._12_4_ = auVar34._12_4_ + auVar92._12_4_;
                        auVar34 = vhaddps_avx(auVar93,auVar93);
                        auVar72 = ZEXT1664(auVar34);
                      }
                      fVar86 = auVar72._0_4_;
                      uVar87 = uVar87 + 1;
                    } while (uVar87 != uVar22);
                  }
                  *(float *)((long)ppp_Var19 + uVar17 * 4) = fVar86 * (1.0 / (float)iVar11);
                  uVar17 = uVar17 + 1;
                } while (uVar17 != uVar13);
              }
              ppp_Var19 = (_func_int ***)((long)ppp_Var19 + (long)(int)uVar13 * 4);
              uVar87 = local_a8 + 1;
            } while (local_a8 + 1 != uVar3);
          }
          local_e8 = local_e8 + 1;
        } while (local_e8 != local_c0);
      }
    }
    else {
      if (iVar10 != 0) {
        return 0;
      }
      iVar10 = (this->super_ROIAlign).sampling_ratio;
      bVar28 = 0 < iVar10;
      fVar86 = (float)iVar10;
      local_58 = vmovshdup_avx(local_d8);
      auVar34 = vroundss_avx(local_58,local_58,10);
      auVar32 = vroundss_avx(local_d8,local_d8,10);
      std::vector<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_>::vector
                (&local_88,
                 (long)(int)uVar12._4_4_ * (long)(int)(undefined4)uVar12 *
                 (long)(int)(float)((uint)bVar28 * (int)fVar86 + (uint)!bVar28 * auVar32._0_4_) *
                 (long)(int)(float)((uint)bVar28 * (int)fVar86 + (uint)!bVar28 * auVar34._0_4_),
                 &local_f9);
      local_48 = vmovshdup_avx(local_b8);
      local_f0 = this;
      original_pre_calc_for_bilinear_interpolate<float>
                (iVar11,uVar13,(this->super_ROIAlign).pooled_height,
                 (this->super_ROIAlign).pooled_width,local_48._0_4_,local_b8._0_4_,
                 (float)local_58._0_4_,(float)local_d8._0_4_,(this->super_ROIAlign).sampling_ratio,
                 &local_88);
      if (0 < (int)local_c0) {
        local_90 = pMVar4->data;
        local_60 = pMVar4->cstep * pMVar4->elemsize;
        local_68 = this_00->data;
        local_70 = this_00->cstep * this_00->elemsize;
        local_a8 = (local_f0->super_ROIAlign).pooled_width;
        auVar82._0_4_ = (float)iVar11;
        auVar82._4_12_ = auVar91;
        uVar87 = (local_f0->super_ROIAlign).pooled_height;
        local_e8 = CONCAT44(local_e8._4_4_,uVar87);
        auVar90._0_4_ = (float)(int)uVar13;
        uStack_a4 = 0;
        local_e0 = (void *)(long)(int)local_a8;
        auVar34 = vbroadcastss_avx512vl(auVar82);
        auVar88._4_4_ = local_d8._0_4_;
        auVar88._0_4_ = local_d8._0_4_;
        auVar88._8_4_ = local_d8._0_4_;
        auVar88._12_4_ = local_d8._0_4_;
        auVar89._4_4_ = local_b8._0_4_;
        auVar89._0_4_ = local_b8._0_4_;
        auVar89._8_4_ = local_b8._0_4_;
        auVar89._12_4_ = local_b8._0_4_;
        auVar90._4_4_ = auVar90._0_4_;
        auVar90._8_4_ = auVar90._0_4_;
        auVar90._12_4_ = auVar90._0_4_;
        local_f8 = 0;
        auVar32 = ZEXT816(0) << 0x40;
        auVar68 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
        auVar69 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        auVar70 = vpbroadcastq_avx512f(ZEXT816(0x10));
        do {
          if (0 < (int)uVar87) {
            lVar25 = local_60 * local_f8;
            iVar11 = (local_f0->super_ROIAlign).sampling_ratio;
            local_d8._0_4_ = iVar11;
            auVar33 = vcvtsi2ss_avx512f(in_XMM29,iVar11);
            pvVar27 = (void *)(local_70 * local_f8 + (long)local_68);
            uVar14 = 0;
            uVar12 = 0;
            do {
              local_b8._0_8_ = uVar14;
              iVar10 = (int)uVar14;
              if (0 < (int)local_a8) {
                auVar35 = vpinsrd_avx(ZEXT416(iVar10 + 1),iVar10,1);
                auVar35 = vcvtdq2ps_avx(auVar35);
                auVar35 = vfmadd213ps_avx512vl(auVar35,local_58,local_48);
                auVar35 = vmaxps_avx(auVar35,auVar32);
                auVar36 = vminps_avx512vl(auVar34,auVar35);
                auVar35 = vmovshdup_avx(auVar36);
                fVar86 = auVar36._0_4_;
                fVar94 = auVar35._0_4_;
                auVar35 = vroundss_avx(ZEXT416((uint)(fVar86 - fVar94)),
                                       ZEXT416((uint)(fVar86 - fVar94)),10);
                uVar13 = (uint)(float)((uint)(0 < iVar11) * auVar33._0_4_ +
                                      (uint)(iVar11 < 1) * auVar35._0_4_);
                uVar15 = (ulong)uVar13;
                uVar14 = 0;
                do {
                  uVar20 = (uint7)(uVar18 >> 8);
                  uVar17 = uVar14 + 1;
                  auVar35 = vpinsrd_avx(ZEXT416((uint)uVar17),(int)uVar14,1);
                  auVar35 = vcvtudq2ps_avx512vl(auVar35);
                  auVar35 = vfmadd213ps_fma(auVar35,auVar88,auVar89);
                  auVar35 = vmaxps_avx(auVar35,auVar32);
                  auVar35 = vminps_avx(auVar90,auVar35);
                  auVar36 = vmovshdup_avx(auVar35);
                  auVar37 = ZEXT416((uint)(auVar35._0_4_ - auVar36._0_4_));
                  auVar37 = vroundss_avx(auVar37,auVar37,10);
                  iVar16 = (int)(float)((uint)(0 < iVar11) * auVar33._0_4_ +
                                       (uint)(iVar11 < 1) * auVar37._0_4_);
                  if ((int)uVar13 < 1) {
                    fVar81 = 0.0;
                  }
                  else {
                    uVar18 = 0;
                    iVar23 = 0;
                    if (0 < iVar16) {
                      iVar23 = iVar16;
                    }
                    auVar71 = vpbroadcastq_avx512f();
                    auVar85 = ZEXT864(0) << 0x20;
                    auVar72 = vpbroadcastq_avx512f();
                    iVar21 = (int)uVar12;
                    do {
                      if (0 < iVar16) {
                        auVar73 = vpbroadcastq_avx512f();
                        auVar74 = vpaddq_avx512f(auVar73,auVar68);
                        auVar73 = vpaddq_avx512f(auVar73,auVar69);
                        auVar76._16_48_ = auVar73._16_48_;
                        auVar76._0_16_ = auVar32;
                        auVar77._4_60_ = auVar76._4_60_;
                        auVar77._0_4_ = auVar85._0_4_;
                        uVar26 = 0;
                        auVar85 = ZEXT1664(auVar77._0_16_);
                        do {
                          auVar80 = auVar85;
                          auVar85 = vpbroadcastq_avx512f();
                          auVar75 = vporq_avx512f(auVar85,auVar68);
                          auVar85 = vporq_avx512f(auVar85,auVar69);
                          uVar8 = vpcmpuq_avx512f(auVar85,auVar71,2);
                          uVar9 = vpcmpuq_avx512f(auVar75,auVar71,2);
                          bVar31 = (byte)uVar9;
                          bVar30 = (byte)uVar8;
                          uVar29 = CONCAT11(bVar31,bVar30);
                          auVar85 = vpsllq_avx512f(auVar73,5);
                          vpaddq_avx512f(auVar72,auVar85);
                          auVar85 = vpsllq_avx512f(auVar74,5);
                          auVar75 = vpaddq_avx512f(auVar72,auVar85);
                          auVar37 = vxorps_avx512vl(in_ZMM19._0_16_,in_ZMM19._0_16_);
                          auVar51 = vgatherqps_avx512f(CONCAT44(_DAT_00000014,_DAT_00000010));
                          auVar52._0_8_ =
                               (ulong)(bVar31 & 1) * auVar51._0_8_ |
                               (ulong)!(bool)(bVar31 & 1) * auVar37._0_8_;
                          bVar28 = (bool)((byte)(uVar9 >> 1) & 1);
                          auVar52._8_8_ =
                               (ulong)bVar28 * auVar51._8_8_ | (ulong)!bVar28 * auVar37._8_8_;
                          auVar52._16_8_ = (ulong)((byte)(uVar9 >> 2) & 1) * auVar51._16_8_;
                          auVar52._24_8_ = (ulong)((byte)(uVar9 >> 3) & 1) * auVar51._24_8_;
                          auVar37 = vxorps_avx512vl(in_ZMM22._0_16_,in_ZMM22._0_16_);
                          auVar51 = vgatherqps_avx512f(*(undefined8 *)(uVar15 + 0x10));
                          auVar38._0_8_ =
                               (ulong)(bVar30 & 1) * auVar51._0_8_ |
                               (ulong)!(bool)(bVar30 & 1) * auVar37._0_8_;
                          bVar28 = (bool)((byte)(uVar8 >> 1) & 1);
                          auVar38._8_8_ =
                               (ulong)bVar28 * auVar51._8_8_ | (ulong)!bVar28 * auVar37._8_8_;
                          in_ZMM19 = vinsertf64x4_avx512f
                                               (ZEXT3264(CONCAT824((ulong)((byte)(uVar8 >> 3) & 1) *
                                                                   auVar51._24_8_,
                                                                   CONCAT816((ulong)((byte)(uVar8 >>
                                                                                           2) & 1) *
                                                                             auVar51._16_8_,auVar38)
                                                                  )),auVar52,1);
                          auVar37 = vxorps_avx512vl(auVar38,auVar38);
                          auVar51 = vpgatherqd_avx512f(*(undefined8 *)
                                                        ((long)&(local_88.
                                                  super__Vector_base<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->pos1 +
                                                  uVar17));
                          auVar39._0_4_ =
                               (uint)(bVar31 & 1) * auVar51._0_4_ |
                               (uint)!(bool)(bVar31 & 1) * auVar37._0_4_;
                          bVar28 = (bool)((byte)(uVar9 >> 1) & 1);
                          auVar39._4_4_ =
                               (uint)bVar28 * auVar51._4_4_ | (uint)!bVar28 * auVar37._4_4_;
                          bVar28 = (bool)((byte)(uVar9 >> 2) & 1);
                          auVar39._8_4_ =
                               (uint)bVar28 * auVar51._8_4_ | (uint)!bVar28 * auVar37._8_4_;
                          bVar28 = (bool)((byte)(uVar9 >> 3) & 1);
                          auVar39._12_4_ =
                               (uint)bVar28 * auVar51._12_4_ | (uint)!bVar28 * auVar37._12_4_;
                          auVar53._16_4_ = (uint)((byte)(uVar9 >> 4) & 1) * auVar51._16_4_;
                          auVar53._0_16_ = auVar39;
                          auVar53._20_4_ = (uint)((byte)(uVar9 >> 5) & 1) * auVar51._20_4_;
                          auVar53._24_4_ = (uint)((byte)(uVar9 >> 6) & 1) * auVar51._24_4_;
                          auVar53._28_4_ = (uint)(byte)(uVar9 >> 7) * auVar51._28_4_;
                          auVar37 = vpxord_avx512vl(auVar85._0_16_,auVar85._0_16_);
                          auVar51 = vpgatherqd_avx512f(*(undefined8 *)
                                                        ((long)&(local_88.
                                                  super__Vector_base<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->pos1 +
                                                  uVar12));
                          auVar40._0_4_ =
                               (uint)(bVar30 & 1) * auVar51._0_4_ |
                               (uint)!(bool)(bVar30 & 1) * auVar37._0_4_;
                          bVar28 = (bool)((byte)(uVar8 >> 1) & 1);
                          auVar40._4_4_ =
                               (uint)bVar28 * auVar51._4_4_ | (uint)!bVar28 * auVar37._4_4_;
                          bVar28 = (bool)((byte)(uVar8 >> 2) & 1);
                          auVar40._8_4_ =
                               (uint)bVar28 * auVar51._8_4_ | (uint)!bVar28 * auVar37._8_4_;
                          bVar28 = (bool)((byte)(uVar8 >> 3) & 1);
                          auVar40._12_4_ =
                               (uint)bVar28 * auVar51._12_4_ | (uint)!bVar28 * auVar37._12_4_;
                          vinserti64x4_avx512f
                                    (ZEXT3264(CONCAT428((uint)(byte)(uVar8 >> 7) * auVar51._28_4_,
                                                        CONCAT424((uint)((byte)(uVar8 >> 6) & 1) *
                                                                  auVar51._24_4_,
                                                                  CONCAT420((uint)((byte)(uVar8 >> 5
                                                                                         ) & 1) *
                                                                            auVar51._20_4_,
                                                                            CONCAT416((uint)((byte)(
                                                  uVar8 >> 4) & 1) * auVar51._16_4_,auVar40))))),
                                     auVar53,1);
                          auVar37 = vpxord_avx512vl(auVar40,auVar40);
                          auVar85 = vgatherdps_avx512f(*(undefined4 *)
                                                        ((long)local_90 + uVar12 * 4 + lVar25));
                          auVar79._0_4_ =
                               (uint)(bVar30 & 1) * auVar85._0_4_ |
                               (uint)!(bool)(bVar30 & 1) * auVar37._0_4_;
                          bVar28 = (bool)((byte)(uVar29 >> 1) & 1);
                          auVar79._4_4_ =
                               (uint)bVar28 * auVar85._4_4_ | (uint)!bVar28 * auVar37._4_4_;
                          bVar28 = (bool)((byte)(uVar29 >> 2) & 1);
                          auVar79._8_4_ =
                               (uint)bVar28 * auVar85._8_4_ | (uint)!bVar28 * auVar37._8_4_;
                          bVar28 = (bool)((byte)(uVar29 >> 3) & 1);
                          auVar79._12_4_ =
                               (uint)bVar28 * auVar85._12_4_ | (uint)!bVar28 * auVar37._12_4_;
                          auVar79._16_4_ = (uint)((byte)(uVar29 >> 4) & 1) * auVar85._16_4_;
                          auVar79._20_4_ = (uint)((byte)(uVar29 >> 5) & 1) * auVar85._20_4_;
                          auVar79._24_4_ = (uint)((byte)(uVar29 >> 6) & 1) * auVar85._24_4_;
                          auVar79._28_4_ = (uint)((byte)(uVar29 >> 7) & 1) * auVar85._28_4_;
                          auVar79._32_4_ = (uint)(bVar31 & 1) * auVar85._32_4_;
                          auVar79._36_4_ = (uint)(bVar31 >> 1 & 1) * auVar85._36_4_;
                          auVar79._40_4_ = (uint)(bVar31 >> 2 & 1) * auVar85._40_4_;
                          auVar79._44_4_ = (uint)(bVar31 >> 3 & 1) * auVar85._44_4_;
                          auVar79._48_4_ = (uint)(bVar31 >> 4 & 1) * auVar85._48_4_;
                          auVar79._52_4_ = (uint)(bVar31 >> 5 & 1) * auVar85._52_4_;
                          auVar79._56_4_ = (uint)(bVar31 >> 6 & 1) * auVar85._56_4_;
                          auVar79._60_4_ = (uint)(bVar31 >> 7) * auVar85._60_4_;
                          auVar51 = vgatherqps_avx512f(CONCAT44(_DAT_00000018,_DAT_00000014));
                          auVar54._8_8_ = (ulong)((byte)(uVar9 >> 1) & 1) * auVar51._8_8_;
                          auVar54._0_8_ = (ulong)(bVar31 & 1) * auVar51._0_8_;
                          auVar54._16_8_ = (ulong)((byte)(uVar9 >> 2) & 1) * auVar51._16_8_;
                          auVar54._24_8_ = (ulong)((byte)(uVar9 >> 3) & 1) * auVar51._24_8_;
                          auVar37 = vpxord_avx512vl(auVar39,auVar39);
                          auVar51 = vgatherqps_avx512f(*(undefined8 *)(uVar15 + 0x14));
                          auVar41._0_8_ =
                               (ulong)(bVar30 & 1) * auVar51._0_8_ |
                               (ulong)!(bool)(bVar30 & 1) * auVar37._0_8_;
                          bVar28 = (bool)((byte)(uVar8 >> 1) & 1);
                          auVar41._8_8_ =
                               (ulong)bVar28 * auVar51._8_8_ | (ulong)!bVar28 * auVar37._8_8_;
                          auVar85 = vinsertf64x4_avx512f
                                              (ZEXT3264(CONCAT824((ulong)((byte)(uVar8 >> 3) & 1) *
                                                                  auVar51._24_8_,
                                                                  CONCAT816((ulong)((byte)(uVar8 >> 
                                                  2) & 1) * auVar51._16_8_,auVar41))),auVar54,1);
                          auVar37 = vxorps_avx512vl(auVar41,auVar41);
                          auVar51 = vpgatherqd_avx512f(CONCAT44(_DAT_00000008,_DAT_00000004));
                          auVar55._0_4_ =
                               (uint)(bVar31 & 1) * auVar51._0_4_ |
                               (uint)!(bool)(bVar31 & 1) * auVar37._0_4_;
                          bVar28 = (bool)((byte)(uVar9 >> 1) & 1);
                          auVar55._4_4_ =
                               (uint)bVar28 * auVar51._4_4_ | (uint)!bVar28 * auVar37._4_4_;
                          bVar28 = (bool)((byte)(uVar9 >> 2) & 1);
                          auVar55._8_4_ =
                               (uint)bVar28 * auVar51._8_4_ | (uint)!bVar28 * auVar37._8_4_;
                          bVar28 = (bool)((byte)(uVar9 >> 3) & 1);
                          auVar55._12_4_ =
                               (uint)bVar28 * auVar51._12_4_ | (uint)!bVar28 * auVar37._12_4_;
                          auVar55._16_4_ = (uint)((byte)(uVar9 >> 4) & 1) * auVar51._16_4_;
                          auVar55._20_4_ = (uint)((byte)(uVar9 >> 5) & 1) * auVar51._20_4_;
                          auVar55._24_4_ = (uint)((byte)(uVar9 >> 6) & 1) * auVar51._24_4_;
                          auVar55._28_4_ = (uint)(byte)(uVar9 >> 7) * auVar51._28_4_;
                          auVar37 = vpxord_avx512vl(in_ZMM23._0_16_,in_ZMM23._0_16_);
                          auVar51 = vpgatherqd_avx512f(*(undefined8 *)(uVar15 + 4));
                          auVar42._0_4_ =
                               (uint)(bVar30 & 1) * auVar51._0_4_ |
                               (uint)!(bool)(bVar30 & 1) * auVar37._0_4_;
                          bVar28 = (bool)((byte)(uVar8 >> 1) & 1);
                          auVar42._4_4_ =
                               (uint)bVar28 * auVar51._4_4_ | (uint)!bVar28 * auVar37._4_4_;
                          bVar28 = (bool)((byte)(uVar8 >> 2) & 1);
                          auVar42._8_4_ =
                               (uint)bVar28 * auVar51._8_4_ | (uint)!bVar28 * auVar37._8_4_;
                          bVar28 = (bool)((byte)(uVar8 >> 3) & 1);
                          auVar42._12_4_ =
                               (uint)bVar28 * auVar51._12_4_ | (uint)!bVar28 * auVar37._12_4_;
                          auVar76 = vinserti64x4_avx512f
                                              (ZEXT3264(CONCAT428((uint)(byte)(uVar8 >> 7) *
                                                                  auVar51._28_4_,
                                                                  CONCAT424((uint)((byte)(uVar8 >> 6
                                                                                         ) & 1) *
                                                                            auVar51._24_4_,
                                                                            CONCAT420((uint)((byte)(
                                                  uVar8 >> 5) & 1) * auVar51._20_4_,
                                                  CONCAT416((uint)((byte)(uVar8 >> 4) & 1) *
                                                            auVar51._16_4_,auVar42))))),auVar55,1);
                          auVar37 = vpxord_avx512vl(auVar42,auVar42);
                          auVar77 = vgatherdps_avx512f(*(undefined4 *)
                                                        ((long)local_90 +
                                                        CONCAT71(uVar20,fVar86 <= fVar94) * 4 +
                                                        lVar25));
                          in_ZMM23._0_4_ =
                               (uint)(bVar30 & 1) * auVar77._0_4_ |
                               (uint)!(bool)(bVar30 & 1) * auVar37._0_4_;
                          bVar28 = (bool)((byte)(uVar29 >> 1) & 1);
                          in_ZMM23._4_4_ =
                               (uint)bVar28 * auVar77._4_4_ | (uint)!bVar28 * auVar37._4_4_;
                          bVar28 = (bool)((byte)(uVar29 >> 2) & 1);
                          in_ZMM23._8_4_ =
                               (uint)bVar28 * auVar77._8_4_ | (uint)!bVar28 * auVar37._8_4_;
                          bVar28 = (bool)((byte)(uVar29 >> 3) & 1);
                          in_ZMM23._12_4_ =
                               (uint)bVar28 * auVar77._12_4_ | (uint)!bVar28 * auVar37._12_4_;
                          in_ZMM23._16_4_ = (uint)((byte)(uVar29 >> 4) & 1) * auVar77._16_4_;
                          in_ZMM23._20_4_ = (uint)((byte)(uVar29 >> 5) & 1) * auVar77._20_4_;
                          in_ZMM23._24_4_ = (uint)((byte)(uVar29 >> 6) & 1) * auVar77._24_4_;
                          in_ZMM23._28_4_ = (uint)((byte)(uVar29 >> 7) & 1) * auVar77._28_4_;
                          in_ZMM23._32_4_ = (uint)(bVar31 & 1) * auVar77._32_4_;
                          in_ZMM23._36_4_ = (uint)(bVar31 >> 1 & 1) * auVar77._36_4_;
                          in_ZMM23._40_4_ = (uint)(bVar31 >> 2 & 1) * auVar77._40_4_;
                          in_ZMM23._44_4_ = (uint)(bVar31 >> 3 & 1) * auVar77._44_4_;
                          in_ZMM23._48_4_ = (uint)(bVar31 >> 4 & 1) * auVar77._48_4_;
                          in_ZMM23._52_4_ = (uint)(bVar31 >> 5 & 1) * auVar77._52_4_;
                          in_ZMM23._56_4_ = (uint)(bVar31 >> 6 & 1) * auVar77._56_4_;
                          in_ZMM23._60_4_ = (uint)(bVar31 >> 7) * auVar77._60_4_;
                          auVar37 = vxorps_avx512vl(auVar76._0_16_,auVar76._0_16_);
                          auVar51 = vgatherqps_avx512f(CONCAT44(_DAT_0000001c,_DAT_00000018));
                          auVar56._0_8_ =
                               (ulong)(bVar31 & 1) * auVar51._0_8_ |
                               (ulong)!(bool)(bVar31 & 1) * auVar37._0_8_;
                          bVar28 = (bool)((byte)(uVar9 >> 1) & 1);
                          auVar56._8_8_ =
                               (ulong)bVar28 * auVar51._8_8_ | (ulong)!bVar28 * auVar37._8_8_;
                          auVar56._16_8_ = (ulong)((byte)(uVar9 >> 2) & 1) * auVar51._16_8_;
                          auVar56._24_8_ = (ulong)((byte)(uVar9 >> 3) & 1) * auVar51._24_8_;
                          auVar37 = vxorps_avx512vl(in_ZMM24._0_16_,in_ZMM24._0_16_);
                          auVar51 = vgatherqps_avx512f(*(undefined8 *)(uVar15 + 0x18));
                          auVar43._0_8_ =
                               (ulong)(bVar30 & 1) * auVar51._0_8_ |
                               (ulong)!(bool)(bVar30 & 1) * auVar37._0_8_;
                          bVar28 = (bool)((byte)(uVar8 >> 1) & 1);
                          auVar43._8_8_ =
                               (ulong)bVar28 * auVar51._8_8_ | (ulong)!bVar28 * auVar37._8_8_;
                          in_ZMM22 = vinsertf64x4_avx512f
                                               (ZEXT3264(CONCAT824((ulong)((byte)(uVar8 >> 3) & 1) *
                                                                   auVar51._24_8_,
                                                                   CONCAT816((ulong)((byte)(uVar8 >>
                                                                                           2) & 1) *
                                                                             auVar51._16_8_,auVar43)
                                                                  )),auVar56,1);
                          auVar37 = vxorps_avx512vl(auVar43,auVar43);
                          auVar51 = vpgatherqd_avx512f(CONCAT44(_DAT_0000000c,_DAT_00000008));
                          auVar57._0_4_ =
                               (uint)(bVar31 & 1) * auVar51._0_4_ |
                               (uint)!(bool)(bVar31 & 1) * auVar37._0_4_;
                          bVar28 = (bool)((byte)(uVar9 >> 1) & 1);
                          auVar57._4_4_ =
                               (uint)bVar28 * auVar51._4_4_ | (uint)!bVar28 * auVar37._4_4_;
                          bVar28 = (bool)((byte)(uVar9 >> 2) & 1);
                          auVar57._8_4_ =
                               (uint)bVar28 * auVar51._8_4_ | (uint)!bVar28 * auVar37._8_4_;
                          bVar28 = (bool)((byte)(uVar9 >> 3) & 1);
                          auVar57._12_4_ =
                               (uint)bVar28 * auVar51._12_4_ | (uint)!bVar28 * auVar37._12_4_;
                          auVar57._16_4_ = (uint)((byte)(uVar9 >> 4) & 1) * auVar51._16_4_;
                          auVar57._20_4_ = (uint)((byte)(uVar9 >> 5) & 1) * auVar51._20_4_;
                          auVar57._24_4_ = (uint)((byte)(uVar9 >> 6) & 1) * auVar51._24_4_;
                          auVar57._28_4_ = (uint)(byte)(uVar9 >> 7) * auVar51._28_4_;
                          auVar37 = vpxord_avx512vl(in_ZMM25._0_16_,in_ZMM25._0_16_);
                          auVar51 = vpgatherqd_avx512f(*(undefined8 *)(uVar15 + 8));
                          auVar44._0_4_ =
                               (uint)(bVar30 & 1) * auVar51._0_4_ |
                               (uint)!(bool)(bVar30 & 1) * auVar37._0_4_;
                          bVar28 = (bool)((byte)(uVar8 >> 1) & 1);
                          auVar44._4_4_ =
                               (uint)bVar28 * auVar51._4_4_ | (uint)!bVar28 * auVar37._4_4_;
                          bVar28 = (bool)((byte)(uVar8 >> 2) & 1);
                          auVar44._8_4_ =
                               (uint)bVar28 * auVar51._8_4_ | (uint)!bVar28 * auVar37._8_4_;
                          bVar28 = (bool)((byte)(uVar8 >> 3) & 1);
                          auVar44._12_4_ =
                               (uint)bVar28 * auVar51._12_4_ | (uint)!bVar28 * auVar37._12_4_;
                          auVar76 = vinserti64x4_avx512f
                                              (ZEXT3264(CONCAT428((uint)(byte)(uVar8 >> 7) *
                                                                  auVar51._28_4_,
                                                                  CONCAT424((uint)((byte)(uVar8 >> 6
                                                                                         ) & 1) *
                                                                            auVar51._24_4_,
                                                                            CONCAT420((uint)((byte)(
                                                  uVar8 >> 5) & 1) * auVar51._20_4_,
                                                  CONCAT416((uint)((byte)(uVar8 >> 4) & 1) *
                                                            auVar51._16_4_,auVar44))))),auVar57,1);
                          auVar37 = vpxord_avx512vl(auVar44,auVar44);
                          auVar77 = vgatherdps_avx512f(*(undefined4 *)
                                                        ((long)local_90 + uVar18 * 4 + lVar25));
                          in_ZMM25._0_4_ =
                               (uint)(bVar30 & 1) * auVar77._0_4_ |
                               (uint)!(bool)(bVar30 & 1) * auVar37._0_4_;
                          bVar28 = (bool)((byte)(uVar29 >> 1) & 1);
                          in_ZMM25._4_4_ =
                               (uint)bVar28 * auVar77._4_4_ | (uint)!bVar28 * auVar37._4_4_;
                          bVar28 = (bool)((byte)(uVar29 >> 2) & 1);
                          in_ZMM25._8_4_ =
                               (uint)bVar28 * auVar77._8_4_ | (uint)!bVar28 * auVar37._8_4_;
                          bVar28 = (bool)((byte)(uVar29 >> 3) & 1);
                          in_ZMM25._12_4_ =
                               (uint)bVar28 * auVar77._12_4_ | (uint)!bVar28 * auVar37._12_4_;
                          in_ZMM25._16_4_ = (uint)((byte)(uVar29 >> 4) & 1) * auVar77._16_4_;
                          in_ZMM25._20_4_ = (uint)((byte)(uVar29 >> 5) & 1) * auVar77._20_4_;
                          in_ZMM25._24_4_ = (uint)((byte)(uVar29 >> 6) & 1) * auVar77._24_4_;
                          in_ZMM25._28_4_ = (uint)((byte)(uVar29 >> 7) & 1) * auVar77._28_4_;
                          in_ZMM25._32_4_ = (uint)(bVar31 & 1) * auVar77._32_4_;
                          in_ZMM25._36_4_ = (uint)(bVar31 >> 1 & 1) * auVar77._36_4_;
                          in_ZMM25._40_4_ = (uint)(bVar31 >> 2 & 1) * auVar77._40_4_;
                          in_ZMM25._44_4_ = (uint)(bVar31 >> 3 & 1) * auVar77._44_4_;
                          in_ZMM25._48_4_ = (uint)(bVar31 >> 4 & 1) * auVar77._48_4_;
                          in_ZMM25._52_4_ = (uint)(bVar31 >> 5 & 1) * auVar77._52_4_;
                          in_ZMM25._56_4_ = (uint)(bVar31 >> 6 & 1) * auVar77._56_4_;
                          in_ZMM25._60_4_ = (uint)(bVar31 >> 7) * auVar77._60_4_;
                          auVar37 = vxorps_avx512vl(auVar76._0_16_,auVar76._0_16_);
                          auVar51 = vgatherqps_avx512f(CONCAT44(_DAT_00000020,_DAT_0000001c));
                          auVar58._0_8_ =
                               (ulong)(bVar31 & 1) * auVar51._0_8_ |
                               (ulong)!(bool)(bVar31 & 1) * auVar37._0_8_;
                          bVar28 = (bool)((byte)(uVar9 >> 1) & 1);
                          auVar58._8_8_ =
                               (ulong)bVar28 * auVar51._8_8_ | (ulong)!bVar28 * auVar37._8_8_;
                          auVar58._16_8_ = (ulong)((byte)(uVar9 >> 2) & 1) * auVar51._16_8_;
                          auVar58._24_8_ = (ulong)((byte)(uVar9 >> 3) & 1) * auVar51._24_8_;
                          auVar37 = vxorps_avx512vl(in_ZMM26._0_16_,in_ZMM26._0_16_);
                          auVar51 = vgatherqps_avx512f(*(undefined8 *)(uVar15 + 0x1c));
                          auVar45._0_8_ =
                               (ulong)(bVar30 & 1) * auVar51._0_8_ |
                               (ulong)!(bool)(bVar30 & 1) * auVar37._0_8_;
                          bVar28 = (bool)((byte)(uVar8 >> 1) & 1);
                          auVar45._8_8_ =
                               (ulong)bVar28 * auVar51._8_8_ | (ulong)!bVar28 * auVar37._8_8_;
                          in_ZMM24 = vinsertf64x4_avx512f
                                               (ZEXT3264(CONCAT824((ulong)((byte)(uVar8 >> 3) & 1) *
                                                                   auVar51._24_8_,
                                                                   CONCAT816((ulong)((byte)(uVar8 >>
                                                                                           2) & 1) *
                                                                             auVar51._16_8_,auVar45)
                                                                  )),auVar58,1);
                          auVar37 = vxorps_avx512vl(auVar45,auVar45);
                          auVar51 = vpgatherqd_avx512f(CONCAT44(_DAT_00000010,_DAT_0000000c));
                          auVar59._0_4_ =
                               (uint)(bVar31 & 1) * auVar51._0_4_ |
                               (uint)!(bool)(bVar31 & 1) * auVar37._0_4_;
                          bVar28 = (bool)((byte)(uVar9 >> 1) & 1);
                          auVar59._4_4_ =
                               (uint)bVar28 * auVar51._4_4_ | (uint)!bVar28 * auVar37._4_4_;
                          bVar28 = (bool)((byte)(uVar9 >> 2) & 1);
                          auVar59._8_4_ =
                               (uint)bVar28 * auVar51._8_4_ | (uint)!bVar28 * auVar37._8_4_;
                          bVar28 = (bool)((byte)(uVar9 >> 3) & 1);
                          auVar59._12_4_ =
                               (uint)bVar28 * auVar51._12_4_ | (uint)!bVar28 * auVar37._12_4_;
                          auVar59._16_4_ = (uint)((byte)(uVar9 >> 4) & 1) * auVar51._16_4_;
                          auVar59._20_4_ = (uint)((byte)(uVar9 >> 5) & 1) * auVar51._20_4_;
                          auVar59._24_4_ = (uint)((byte)(uVar9 >> 6) & 1) * auVar51._24_4_;
                          auVar59._28_4_ = (uint)(byte)(uVar9 >> 7) * auVar51._28_4_;
                          in_ZMM26 = ZEXT3264(auVar59);
                          auVar37 = vpxord_avx512vl(auVar75._0_16_,auVar75._0_16_);
                          auVar51 = vpgatherqd_avx512f(*(undefined8 *)(uVar15 + 0xc));
                          auVar46._0_4_ =
                               (uint)(bVar30 & 1) * auVar51._0_4_ |
                               (uint)!(bool)(bVar30 & 1) * auVar37._0_4_;
                          bVar28 = (bool)((byte)(uVar8 >> 1) & 1);
                          auVar46._4_4_ =
                               (uint)bVar28 * auVar51._4_4_ | (uint)!bVar28 * auVar37._4_4_;
                          bVar28 = (bool)((byte)(uVar8 >> 2) & 1);
                          auVar46._8_4_ =
                               (uint)bVar28 * auVar51._8_4_ | (uint)!bVar28 * auVar37._8_4_;
                          bVar28 = (bool)((byte)(uVar8 >> 3) & 1);
                          auVar46._12_4_ =
                               (uint)bVar28 * auVar51._12_4_ | (uint)!bVar28 * auVar37._12_4_;
                          vinserti64x4_avx512f
                                    (ZEXT3264(CONCAT428((uint)(byte)(uVar8 >> 7) * auVar51._28_4_,
                                                        CONCAT424((uint)((byte)(uVar8 >> 6) & 1) *
                                                                  auVar51._24_4_,
                                                                  CONCAT420((uint)((byte)(uVar8 >> 5
                                                                                         ) & 1) *
                                                                            auVar51._20_4_,
                                                                            CONCAT416((uint)((byte)(
                                                  uVar8 >> 4) & 1) * auVar51._16_4_,auVar46))))),
                                     auVar59,1);
                          auVar37 = vpxord_avx512vl(auVar46,auVar46);
                          auVar75 = vgatherdps_avx512f(*(undefined4 *)
                                                        ((long)local_90 + uVar15 * 4 + lVar25));
                          auVar78._0_4_ =
                               (uint)(bVar30 & 1) * auVar75._0_4_ |
                               (uint)!(bool)(bVar30 & 1) * auVar37._0_4_;
                          bVar28 = (bool)((byte)(uVar29 >> 1) & 1);
                          auVar78._4_4_ =
                               (uint)bVar28 * auVar75._4_4_ | (uint)!bVar28 * auVar37._4_4_;
                          bVar28 = (bool)((byte)(uVar29 >> 2) & 1);
                          auVar78._8_4_ =
                               (uint)bVar28 * auVar75._8_4_ | (uint)!bVar28 * auVar37._8_4_;
                          bVar28 = (bool)((byte)(uVar29 >> 3) & 1);
                          auVar78._12_4_ =
                               (uint)bVar28 * auVar75._12_4_ | (uint)!bVar28 * auVar37._12_4_;
                          auVar78._16_4_ = (uint)((byte)(uVar29 >> 4) & 1) * auVar75._16_4_;
                          auVar78._20_4_ = (uint)((byte)(uVar29 >> 5) & 1) * auVar75._20_4_;
                          auVar78._24_4_ = (uint)((byte)(uVar29 >> 6) & 1) * auVar75._24_4_;
                          auVar78._28_4_ = (uint)((byte)(uVar29 >> 7) & 1) * auVar75._28_4_;
                          auVar78._32_4_ = (uint)(bVar31 & 1) * auVar75._32_4_;
                          auVar78._36_4_ = (uint)(bVar31 >> 1 & 1) * auVar75._36_4_;
                          auVar78._40_4_ = (uint)(bVar31 >> 2 & 1) * auVar75._40_4_;
                          auVar78._44_4_ = (uint)(bVar31 >> 3 & 1) * auVar75._44_4_;
                          auVar78._48_4_ = (uint)(bVar31 >> 4 & 1) * auVar75._48_4_;
                          auVar78._52_4_ = (uint)(bVar31 >> 5 & 1) * auVar75._52_4_;
                          auVar78._56_4_ = (uint)(bVar31 >> 6 & 1) * auVar75._56_4_;
                          auVar78._60_4_ = (uint)(bVar31 >> 7) * auVar75._60_4_;
                          auVar75 = vfmadd213ps_avx512f(auVar79,in_ZMM19,auVar80);
                          auVar85 = vfmadd231ps_avx512f(auVar75,auVar85,in_ZMM23);
                          auVar85 = vfmadd231ps_avx512f(auVar85,in_ZMM22,in_ZMM25);
                          auVar85 = vfmadd231ps_avx512f(auVar85,in_ZMM24,auVar78);
                          uVar26 = uVar26 + 0x10;
                          auVar73 = vpaddq_avx512f(auVar73,auVar70);
                          auVar74 = vpaddq_avx512f(auVar74,auVar70);
                        } while ((iVar16 + 0xfU & 0xfffffff0) != uVar26);
                        auVar74._0_4_ =
                             (uint)(bVar30 & 1) * auVar85._0_4_ |
                             (uint)!(bool)(bVar30 & 1) * auVar80._0_4_;
                        bVar28 = (bool)((byte)(uVar29 >> 1) & 1);
                        auVar74._4_4_ = (uint)bVar28 * auVar85._4_4_ | (uint)!bVar28 * auVar80._4_4_
                        ;
                        bVar28 = (bool)((byte)(uVar29 >> 2) & 1);
                        auVar74._8_4_ = (uint)bVar28 * auVar85._8_4_ | (uint)!bVar28 * auVar80._8_4_
                        ;
                        bVar28 = (bool)((byte)(uVar29 >> 3) & 1);
                        auVar74._12_4_ =
                             (uint)bVar28 * auVar85._12_4_ | (uint)!bVar28 * auVar80._12_4_;
                        bVar28 = (bool)((byte)(uVar29 >> 4) & 1);
                        auVar74._16_4_ =
                             (uint)bVar28 * auVar85._16_4_ | (uint)!bVar28 * auVar80._16_4_;
                        bVar28 = (bool)((byte)(uVar29 >> 5) & 1);
                        auVar74._20_4_ =
                             (uint)bVar28 * auVar85._20_4_ | (uint)!bVar28 * auVar80._20_4_;
                        bVar28 = (bool)((byte)(uVar29 >> 6) & 1);
                        auVar74._24_4_ =
                             (uint)bVar28 * auVar85._24_4_ | (uint)!bVar28 * auVar80._24_4_;
                        bVar28 = (bool)((byte)(uVar29 >> 7) & 1);
                        auVar74._28_4_ =
                             (uint)bVar28 * auVar85._28_4_ | (uint)!bVar28 * auVar80._28_4_;
                        auVar74._32_4_ =
                             (uint)(bVar31 & 1) * auVar85._32_4_ |
                             (uint)!(bool)(bVar31 & 1) * auVar80._32_4_;
                        bVar28 = (bool)(bVar31 >> 1 & 1);
                        auVar74._36_4_ =
                             (uint)bVar28 * auVar85._36_4_ | (uint)!bVar28 * auVar80._36_4_;
                        bVar28 = (bool)(bVar31 >> 2 & 1);
                        auVar74._40_4_ =
                             (uint)bVar28 * auVar85._40_4_ | (uint)!bVar28 * auVar80._40_4_;
                        bVar28 = (bool)(bVar31 >> 3 & 1);
                        auVar74._44_4_ =
                             (uint)bVar28 * auVar85._44_4_ | (uint)!bVar28 * auVar80._44_4_;
                        bVar28 = (bool)(bVar31 >> 4 & 1);
                        auVar74._48_4_ =
                             (uint)bVar28 * auVar85._48_4_ | (uint)!bVar28 * auVar80._48_4_;
                        bVar28 = (bool)(bVar31 >> 5 & 1);
                        auVar74._52_4_ =
                             (uint)bVar28 * auVar85._52_4_ | (uint)!bVar28 * auVar80._52_4_;
                        bVar28 = (bool)(bVar31 >> 6 & 1);
                        auVar74._56_4_ =
                             (uint)bVar28 * auVar85._56_4_ | (uint)!bVar28 * auVar80._56_4_;
                        auVar74._60_4_ =
                             (uint)(bVar31 >> 7) * auVar85._60_4_ |
                             (uint)!(bool)(bVar31 >> 7) * auVar80._60_4_;
                        auVar51 = vextractf64x4_avx512f(auVar74,1);
                        auVar85 = vaddps_avx512f(auVar74,ZEXT3264(auVar51));
                        auVar83._0_4_ = auVar85._16_4_ + auVar85._0_4_;
                        auVar83._4_4_ = auVar85._20_4_ + auVar85._4_4_;
                        auVar83._8_4_ = auVar85._24_4_ + auVar85._8_4_;
                        auVar83._12_4_ = auVar85._28_4_ + auVar85._12_4_;
                        auVar37 = vshufpd_avx(auVar83,auVar83,1);
                        auVar84._0_4_ = auVar37._0_4_ + auVar83._0_4_;
                        auVar84._4_4_ = auVar37._4_4_ + auVar83._4_4_;
                        auVar84._8_4_ = auVar37._8_4_ + auVar83._8_4_;
                        auVar84._12_4_ = auVar37._12_4_ + auVar83._12_4_;
                        auVar37 = vhaddps_avx(auVar84,auVar84);
                        auVar85 = ZEXT1664(auVar37);
                        uVar12 = (ulong)(uint)((int)uVar12 + iVar16);
                      }
                      fVar81 = auVar85._0_4_;
                      uVar22 = (int)uVar18 + 1;
                      uVar18 = (ulong)uVar22;
                    } while (uVar22 != uVar13);
                    uVar12 = (ulong)(iVar21 + iVar23 * uVar13);
                  }
                  auVar37 = vcvtsi2ss_avx512f(in_XMM29,iVar16 * uVar13);
                  uVar18 = (ulong)uVar20 << 8;
                  *(uint *)((long)pvVar27 + uVar14 * 4) =
                       (uint)(fVar86 > fVar94 && auVar36._0_4_ < auVar35._0_4_) *
                       (int)(fVar81 / auVar37._0_4_);
                  uVar14 = uVar17;
                } while (uVar17 != local_a8);
              }
              pvVar27 = (void *)((long)pvVar27 + (long)local_e0 * 4);
              uVar14 = (ulong)(iVar10 + 1U);
            } while (iVar10 + 1U != uVar87);
          }
          local_f8 = local_f8 + 1;
        } while (local_f8 != local_c0);
      }
    }
    if (local_88.super__Vector_base<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_88.
                      super__Vector_base<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_88.
                            super__Vector_base<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_88.
                            super__Vector_base<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    iVar10 = 0;
  }
  return iVar10;
}

Assistant:

int ROIAlign_x86_avx512::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const int width = bottom_blob.w;
    const int height = bottom_blob.h;
    const size_t elemsize = bottom_blob.elemsize;
    const int channels = bottom_blob.c;

    const Mat& roi_blob = bottom_blobs[1];

    Mat& top_blob = top_blobs[0];
    top_blob.create(pooled_width, pooled_height, channels, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // For each ROI R = [x y w h]: max pool over R
    const float* roi_ptr = roi_blob;

    float roi_start_w = roi_ptr[0] * spatial_scale;
    float roi_start_h = roi_ptr[1] * spatial_scale;
    float roi_end_w = roi_ptr[2] * spatial_scale;
    float roi_end_h = roi_ptr[3] * spatial_scale;
    if (aligned)
    {
        roi_start_w -= 0.5f;
        roi_start_h -= 0.5f;
        roi_end_w -= 0.5f;
        roi_end_h -= 0.5f;
    }

    float roi_width = roi_end_w - roi_start_w;
    float roi_height = roi_end_h - roi_start_h;

    if (!aligned)
    {
        roi_width = std::max(roi_width, 1.f);
        roi_height = std::max(roi_height, 1.f);
    }

    float bin_size_w = (float)roi_width / (float)pooled_width;
    float bin_size_h = (float)roi_height / (float)pooled_height;

    if (version == 0)
    {
        // original version
        int roi_bin_grid_h = (int)(sampling_ratio > 0 ? sampling_ratio : ceil(roi_height / pooled_height));
        int roi_bin_grid_w = (int)(sampling_ratio > 0 ? sampling_ratio : ceil(roi_width / pooled_width));
        std::vector<PreCalc<float> > pre_calc(
            (size_t)roi_bin_grid_h * roi_bin_grid_w * pooled_width * pooled_height);
        original_pre_calc_for_bilinear_interpolate(
            height,
            width,
            pooled_height,
            pooled_width,
            roi_start_h,
            roi_start_w,
            bin_size_h,
            bin_size_w,
            sampling_ratio,
            pre_calc);

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);
            int pre_calc_index = 0;

            for (int ph = 0; ph < pooled_height; ph++)
            {
                for (int pw = 0; pw < pooled_width; pw++)
                {
                    // Compute pooling region for this output unit:
                    //  start (included) = ph * roi_height / pooled_height
                    //  end (excluded) = (ph + 1) * roi_height / pooled_height
                    float hstart = roi_start_h + ph * bin_size_h;
                    float wstart = roi_start_w + pw * bin_size_w;
                    float hend = roi_start_h + (ph + 1) * bin_size_h;
                    float wend = roi_start_w + (pw + 1) * bin_size_w;

                    hstart = std::min(std::max(hstart, 0.f), (float)height);
                    wstart = std::min(std::max(wstart, 0.f), (float)width);
                    hend = std::min(std::max(hend, 0.f), (float)height);
                    wend = std::min(std::max(wend, 0.f), (float)width);

                    int bin_grid_h = (int)(sampling_ratio > 0 ? sampling_ratio : ceil(hend - hstart));
                    int bin_grid_w = (int)(sampling_ratio > 0 ? sampling_ratio : ceil(wend - wstart));

                    bool is_empty = (hend <= hstart) || (wend <= wstart);
                    int area = bin_grid_h * bin_grid_w;

                    float sum = 0.f;
                    for (int by = 0; by < bin_grid_h; by++)
                    {
                        for (int bx = 0; bx < bin_grid_w; bx++)
                        {
                            PreCalc<float>& pc = pre_calc[pre_calc_index++];
                            // bilinear interpolate at (x,y)
                            sum += pc.w1 * ptr[pc.pos1] + pc.w2 * ptr[pc.pos2] + pc.w3 * ptr[pc.pos3] + pc.w4 * ptr[pc.pos4];
                        }
                    }
                    outptr[pw] = is_empty ? 0.f : (sum / (float)area);
                }

                outptr += pooled_width;
            }
        }
    }
    else if (version == 1)
    {
        // the version in detectron 2
        int roi_bin_grid_h = (int)(sampling_ratio > 0 ? sampling_ratio : ceil(roi_height / pooled_height));
        int roi_bin_grid_w = (int)(sampling_ratio > 0 ? sampling_ratio : ceil(roi_width / pooled_width));

        const float count = (float)std::max(roi_bin_grid_h * roi_bin_grid_w, 1);

        std::vector<PreCalc<float> > pre_calc(
            (size_t)roi_bin_grid_h * roi_bin_grid_w * pooled_width * pooled_height);
        detectron2_pre_calc_for_bilinear_interpolate(
            height,
            width,
            pooled_height,
            pooled_width,
            roi_bin_grid_h,
            roi_bin_grid_w,
            roi_start_h,
            roi_start_w,
            bin_size_h,
            bin_size_w,
            roi_bin_grid_h,
            roi_bin_grid_w,
            pre_calc);

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);
            int pre_calc_index = 0;

            for (int ph = 0; ph < pooled_height; ph++)
            {
                for (int pw = 0; pw < pooled_width; pw++)
                {
                    float output_val = 0.f;
                    for (int iy = 0; iy < roi_bin_grid_h; iy++)
                    {
                        for (int ix = 0; ix < roi_bin_grid_w; ix++)
                        {
                            PreCalc<float>& pc = pre_calc[pre_calc_index++];

                            output_val += pc.w1 * ptr[pc.pos1] + pc.w2 * ptr[pc.pos2] + pc.w3 * ptr[pc.pos3] + pc.w4 * ptr[pc.pos4];
                        }
                    }
                    output_val /= count;
                    outptr[pw] = output_val;
                }
                outptr += pooled_width;
            }
        }
    }

    return 0;
}